

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree_handler.c
# Opt level: O0

ion_err_t bpptree_close_dictionary(ion_dictionary_t *dictionary)

{
  ion_dictionary_parent_t *piVar1;
  ion_bpp_err_t iVar2;
  ion_bpp_err_t bErr;
  ion_bpptree_t *bpptree;
  ion_dictionary_t *dictionary_local;
  
  piVar1 = dictionary->instance;
  iVar2 = b_close(*(ion_bpp_handle_t *)(piVar1 + 1));
  ion_fclose(*(ion_file_handle_t *)&piVar1[1].record.value_size);
  free(dictionary->instance);
  dictionary->instance = (ion_dictionary_parent_t *)0x0;
  if (iVar2 == bErrOk) {
    dictionary_local._7_1_ = '\0';
  }
  else {
    dictionary_local._7_1_ = '\x04';
  }
  return dictionary_local._7_1_;
}

Assistant:

ion_err_t
bpptree_close_dictionary(
	ion_dictionary_t *dictionary
) {
	ion_bpptree_t	*bpptree;
	ion_bpp_err_t	bErr;

	bpptree					= (ion_bpptree_t *) dictionary->instance;
	bErr					= b_close(bpptree->tree);
	ion_fclose(bpptree->values.file_handle);
	free(dictionary->instance);
	dictionary->instance	= NULL;

	if (bErrOk != bErr) {
		return err_dictionary_destruction_error;
	}

	return err_ok;
}